

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O3

string * ctemplate::StringToTemplateFile(string *__return_storage_ptr__,string *s)

{
  size_t sVar1;
  long *plVar2;
  long *plVar3;
  char *__s;
  char buf [16];
  long *local_98;
  long local_88;
  long lStack_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  char local_38 [16];
  
  StringToTemplateFile::filenum = StringToTemplateFile::filenum + 1;
  snprintf(local_38,0x10,"%03d");
  __s = "";
  if (g_tmpdir != (char *)0x0) {
    __s = g_tmpdir;
  }
  local_58[0] = local_48;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,__s,__s + sVar1);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"template.","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_78);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_88 = *plVar3;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar3;
    local_98 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ctemplate::PathJoin((string *)__return_storage_ptr__,(string *)local_58);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  StringToFile(s,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string StringToTemplateFile(const string& s) {
  static int filenum = 0;
  char buf[16];
  snprintf(buf, sizeof(buf), "%03d", ++filenum);
  string filename = PathJoin(g_tmpdir ? g_tmpdir : "",
                             string("template.") + buf);
  StringToFile(s, filename);
  return filename;
}